

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::FirstState<double>,double,duckdb::FirstFunction<false,false>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  undefined8 *puVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  ulong uVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = *(undefined8 **)states->data;
    if (*(char *)(puVar1 + 1) == '\0') {
      pdVar2 = input->data;
      puVar3 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        *(undefined2 *)(puVar1 + 1) = 1;
        *puVar1 = *(undefined8 *)pdVar2;
      }
      else {
        *(undefined2 *)(puVar1 + 1) = 0x101;
      }
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    pdVar4 = states->data;
    FlatVector::VerifyFlatVector(input);
    if (count != 0) {
      puVar3 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar7 = 0;
      do {
        puVar1 = *(undefined8 **)(pdVar4 + uVar7 * 8);
        if (*(char *)(puVar1 + 1) == '\0') {
          if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))
          {
            *(undefined2 *)(puVar1 + 1) = 1;
            *puVar1 = *(undefined8 *)(pdVar2 + uVar7 * 8);
          }
          else {
            *(undefined2 *)(puVar1 + 1) = 0x101;
          }
        }
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_b0);
    Vector::ToUnifiedFormat(states,count,&local_68);
    if (count != 0) {
      psVar5 = (local_b0.sel)->sel_vector;
      psVar6 = (local_68.sel)->sel_vector;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar5 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar5[iVar8];
        }
        iVar10 = iVar8;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar8];
        }
        puVar1 = *(undefined8 **)(local_68.data + iVar10 * 8);
        if (*(char *)(puVar1 + 1) == '\0') {
          if ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) {
            *(undefined2 *)(puVar1 + 1) = 1;
            *puVar1 = *(undefined8 *)(local_b0.data + iVar9 * 8);
          }
          else {
            *(undefined2 *)(puVar1 + 1) = 0x101;
          }
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}